

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

apx_error_t apx_file_create(apx_file_t *self,rmf_fileInfo_t *file_info)

{
  apx_error_t retval;
  rmf_fileInfo_t *file_info_local;
  apx_file_t *self_local;
  
  if ((self == (apx_file_t *)0x0) || (file_info == (rmf_fileInfo_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    self->is_file_open = false;
    self->has_first_write = false;
    self->file_manager = (apx_fileManager_tag *)0x0;
    self->apx_file_type = '\0';
    memset(&self->notification_handler,0,0x20);
    adt_list_create(&self->event_listeners,apx_fileEventListener_vdelete);
    self_local._4_4_ = rmf_fileInfo_create_copy(&self->file_info,file_info);
    if (self_local._4_4_ == 0) {
      apx_file_calc_file_type(self);
      pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_file_create(apx_file_t* self, const rmf_fileInfo_t* file_info)
{
   if ( (self != NULL) && (file_info != NULL))
   {
      apx_error_t retval = APX_NO_ERROR;
      self->is_file_open = false;
      self->has_first_write = false;
      self->file_manager = (apx_fileManager_t*) NULL;
      self->apx_file_type = APX_UNKNOWN_FILE_TYPE;
      memset(&self->notification_handler, 0, sizeof(apx_fileNotificationHandler_t));
      adt_list_create(&self->event_listeners, apx_fileEventListener_vdelete);
      retval = rmf_fileInfo_create_copy(&self->file_info, file_info);
      if (retval == APX_NO_ERROR)
      {
         apx_file_calc_file_type(self);
         MUTEX_INIT(self->lock);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}